

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

uintptr_t Js::StackScriptFunction::BoxState::GetNativeScopeSlotsIndex(FunctionBody *functionBody)

{
  ArgSlot AVar1;
  FunctionBody *functionBody_local;
  
  AVar1 = ParseableFunctionInfo::GetInParamsCount(&functionBody->super_ParseableFunctionInfo);
  if (AVar1 == 0) {
    functionBody_local = (FunctionBody *)0xfffffffffffffffb;
  }
  else {
    functionBody_local = (FunctionBody *)0xfffffffffffffffa;
  }
  return (uintptr_t)functionBody_local;
}

Assistant:

uintptr_t StackScriptFunction::BoxState::GetNativeScopeSlotsIndex(FunctionBody * functionBody)
    {
#if _M_IX86 || _M_AMD64
        if (functionBody->GetInParamsCount() == 0)
        {
            return (uintptr_t)JavascriptFunctionArgIndex_StackScopeSlotsNoArg;
        }
        else
#endif
        {
            return (uintptr_t)JavascriptFunctionArgIndex_StackScopeSlots;
        }
    }